

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autonomy2.hpp
# Opt level: O3

void __thiscall Autonomy2::Autonomy2(Autonomy2 *this,ControlArbiter *a,Sender *send)

{
  *(undefined8 *)((long)&(this->receivedControlBuffer).m.super___mutex_base._M_mutex + 0x10) = 0;
  (this->receivedControlBuffer).m.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->receivedControlBuffer).m.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->receivedControlBuffer).m.super___mutex_base._M_mutex + 8) = 0;
  (this->receivedControlBuffer).m.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  std::condition_variable::condition_variable(&(this->receivedControlBuffer).c);
  (this->receivedControlBuffer).count = 0;
  (this->receivedControlBuffer).front = (Control *)this;
  (this->receivedControlBuffer).middle = (this->receivedControlBuffer).buffer + 1;
  (this->receivedControlBuffer).back = (this->receivedControlBuffer).buffer + 2;
  TripleBuffer<Autonomy2::Blob>::TripleBuffer(&this->receivedTargetBuffer);
  this->thresholdLow = 0xaf0;
  this->thresholdHigh = 0xe10;
  (this->aPID).p = 0.0;
  (this->aPID).i = 0.0;
  (this->aPID).d = 0.0;
  (this->aPID).processMax = 0.5;
  (this->aPID).sum = 0.0;
  (this->aPID).sumMax = 1.0;
  (this->aPID).lastDeriv[0] = 0.0;
  (this->aPID).lastDeriv[1] = 0.0;
  (this->aPID).lastDeriv[2] = 0.0;
  (this->aPID).lastDeriv[3] = 0.0;
  (this->aPID).lastError = 0.0;
  (this->aPID).lastDerivIndex = 0;
  (this->ePID).p = 0.0;
  (this->ePID).i = 0.0;
  (this->ePID).d = 0.0;
  (this->ePID).processMax = 0.5;
  (this->ePID).sum = 0.0;
  (this->ePID).sumMax = 1.0;
  (this->ePID).lastDeriv[0] = 0.0;
  (this->ePID).lastDeriv[1] = 0.0;
  (this->ePID).lastDeriv[2] = 0.0;
  (this->ePID).lastDeriv[3] = 0.0;
  (this->ePID).lastError = 0.0;
  (this->ePID).lastDerivIndex = 0;
  (this->tPID).p = 0.0;
  (this->tPID).i = 0.0;
  (this->tPID).d = 0.0;
  (this->tPID).processMax = 0.5;
  (this->tPID).sum = 0.0;
  (this->tPID).sumMax = 1.0;
  (this->tPID).lastDeriv[0] = 0.0;
  (this->tPID).lastDeriv[1] = 0.0;
  (this->tPID).lastDeriv[2] = 0.0;
  (this->tPID).lastDeriv[3] = 0.0;
  (this->tPID).lastError = 0.0;
  (this->tPID).lastDerivIndex = 0;
  (this->rPID).p = 0.0;
  (this->rPID).i = 0.0;
  (this->rPID).d = 0.0;
  (this->rPID).processMax = 0.5;
  (this->rPID).sum = 0.0;
  (this->rPID).sumMax = 1.0;
  (this->pidMutex).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0
  ;
  (this->pidMutex).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0
  ;
  *(undefined8 *)((long)&(this->pidMutex).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->pidMutex).super___mutex_base._M_mutex + 0x10) = 0;
  (this->rPID).lastError = 0.0;
  (this->rPID).lastDerivIndex = 0;
  (this->pidMutex).super___mutex_base._M_mutex.__align = 0;
  (this->rPID).lastDeriv[0] = 0.0;
  (this->rPID).lastDeriv[1] = 0.0;
  (this->rPID).lastDeriv[2] = 0.0;
  (this->rPID).lastDeriv[3] = 0.0;
  this->arbiter = a;
  this->send = send;
  (this->buffer).m.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->buffer).m.super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->buffer).m.super___mutex_base._M_mutex + 0x10) = 0;
  (this->buffer).m.super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0
  ;
  (this->buffer).m.super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0
  ;
  std::condition_variable::condition_variable(&(this->buffer).c);
  (this->buffer).count = 0;
  (this->buffer).front = (unsigned_short (*) [60] [80])&this->buffer;
  (this->buffer).middle = (this->buffer).buffer + 1;
  (this->buffer).back = (this->buffer).buffer + 2;
  return;
}

Assistant:

Autonomy2(ControlArbiter &a, Sender &send) : arbiter(a), send(send), thresholdLow(2800), thresholdHigh(3600) {}